

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_pwm_set_clock(uint32_t divisor)

{
  uint uVar1;
  timespec local_28;
  
  if ((bcm2835_clk != (uint32_t *)0xffffffffffffffff) &&
     (bcm2835_pwm != (uint32_t *)0xffffffffffffffff)) {
    if (debug == '\0') {
      bcm2835_clk[0x28] = 0x5a000001;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_clk + 0x28,0x5a000001);
    }
    local_28.tv_sec = 0;
    local_28.tv_nsec = 110000000;
    nanosleep(&local_28,(timespec *)0x0);
    while (debug == '\0') {
      if (-1 < (char)bcm2835_clk[0x28]) goto LAB_00103baf;
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1000000;
      nanosleep(&local_28,(timespec *)0x0);
    }
    printf("bcm2835_peri_read  paddr %p\n");
LAB_00103baf:
    uVar1 = (divisor & 0xfff) << 0xc | 0x5a000000;
    if (debug == '\0') {
      bcm2835_clk[0x29] = uVar1;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_clk + 0x29,(ulong)uVar1);
    }
    if (debug == '\0') {
      bcm2835_clk[0x28] = 0x5a000011;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_clk + 0x28,0x5a000011);
    }
  }
  return;
}

Assistant:

void bcm2835_pwm_set_clock(uint32_t divisor)
{
    if (   bcm2835_clk == MAP_FAILED
        || bcm2835_pwm == MAP_FAILED)
      return; /* bcm2835_init() failed or not root */
  
    /* From Gerts code */
    divisor &= 0xfff;
    /* Stop PWM clock */
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_CNTL, BCM2835_PWM_PASSWRD | 0x01);
    bcm2835_delay(110); /* Prevents clock going slow */
    /* Wait for the clock to be not busy */
    while ((bcm2835_peri_read(bcm2835_clk + BCM2835_PWMCLK_CNTL) & 0x80) != 0)
	bcm2835_delay(1); 
    /* set the clock divider and enable PWM clock */
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_DIV, BCM2835_PWM_PASSWRD | (divisor << 12));
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_CNTL, BCM2835_PWM_PASSWRD | 0x11); /* Source=osc and enable */
}